

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  CallReaction reaction_00;
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  undefined4 extraout_var;
  UntypedFunctionMockerBase *pUVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar5;
  char *pcVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *local_918;
  UntypedFunctionMockerBase *local_900;
  ostream *local_8e0;
  ostream *local_8d0;
  UntypedFunctionMockerBase *local_8b0;
  bool local_889;
  undefined1 *local_878;
  ostream *local_868;
  undefined1 *local_850;
  undefined1 *local_830;
  bool local_80a;
  bool local_809;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  string local_7a0;
  string local_780;
  string local_760 [39];
  byte local_739;
  string local_738 [32];
  UntypedFunctionMockerBase *local_718;
  UntypedActionResultHolderBase *result;
  string local_708 [38];
  bool local_6e2;
  byte local_6e1;
  bool need_to_report_call;
  ExpectationBase *pEStack_6e0;
  bool found;
  ExpectationBase *untyped_expectation;
  void *untyped_action;
  stringstream loc;
  ostream aoStack_6c0 [376];
  stringstream local_548 [8];
  stringstream why;
  undefined1 auStack_538 [376];
  stringstream local_3c0 [8];
  stringstream ss;
  ostream local_3b0 [383];
  byte local_231;
  undefined1 local_230 [7];
  bool is_excessive;
  string local_210 [32];
  UntypedFunctionMockerBase *local_1f0;
  UntypedActionResultHolderBase *result_1;
  stringstream ss_1;
  undefined1 auStack_1d8 [399];
  allocator local_49;
  string local_48 [35];
  bool local_25;
  CallReaction local_24;
  bool need_to_report_uninteresting_call;
  void *pvStack_20;
  CallReaction reaction;
  void *untyped_args_local;
  UntypedFunctionMockerBase *this_local;
  undefined4 extraout_var_00;
  
  pvStack_20 = untyped_args;
  untyped_args_local = this;
  sVar2 = std::
          vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
          ::size(&this->untyped_expectations_);
  if (sVar2 == 0) {
    pvVar3 = MockObject(this);
    local_24 = Mock::GetReactionOnUninterestingCalls(pvVar3);
    if (local_24 == kAllow) {
      local_809 = LogIsVisible(kInfo);
    }
    else {
      if (local_24 == kDefault) {
        local_80a = LogIsVisible(kWarning);
      }
      else {
        local_80a = true;
      }
      local_809 = local_80a;
    }
    pvVar3 = pvStack_20;
    local_25 = local_809;
    if (local_809 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"",&local_49);
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_48);
      this_local = (UntypedFunctionMockerBase *)CONCAT44(extraout_var,iVar1);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&result_1);
      local_830 = (undefined1 *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1e8) {
        local_830 = auStack_1d8;
      }
      (*this->_vptr_UntypedFunctionMockerBase[5])(this,pvStack_20,local_830);
      pvVar3 = pvStack_20;
      std::__cxx11::stringstream::str();
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_210);
      pUVar4 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_00,iVar1);
      std::__cxx11::string::~string(local_210);
      local_1f0 = pUVar4;
      if (pUVar4 != (UntypedFunctionMockerBase *)0x0) {
        local_850 = (undefined1 *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x1e8) {
          local_850 = auStack_1d8;
        }
        (*pUVar4->_vptr_UntypedFunctionMockerBase[2])(pUVar4,local_850);
      }
      reaction_00 = local_24;
      std::__cxx11::stringstream::str();
      ReportUninterestingCall(reaction_00,(string *)local_230);
      std::__cxx11::string::~string((string *)local_230);
      this_local = local_1f0;
      std::__cxx11::stringstream::~stringstream((stringstream *)&result_1);
    }
  }
  else {
    local_231 = 0;
    std::__cxx11::stringstream::stringstream(local_3c0);
    std::__cxx11::stringstream::stringstream(local_548);
    std::__cxx11::stringstream::stringstream((stringstream *)&untyped_action);
    untyped_expectation = (ExpectationBase *)0x0;
    local_868 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x3c0) {
      local_868 = local_3b0;
    }
    local_878 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x548) {
      local_878 = auStack_538;
    }
    iVar1 = (*this->_vptr_UntypedFunctionMockerBase[6])
                      (this,pvStack_20,&untyped_expectation,&local_231,local_868,local_878);
    pEStack_6e0 = (ExpectationBase *)CONCAT44(extraout_var_01,iVar1);
    local_6e1 = pEStack_6e0 != (ExpectationBase *)0x0;
    local_889 = true;
    if (((bool)local_6e1) && (local_889 = true, (local_231 & 1) == 0)) {
      local_889 = LogIsVisible(kInfo);
    }
    pvVar3 = pvStack_20;
    local_6e2 = local_889;
    if (local_889 == false) {
      result._6_1_ = 0;
      result._5_1_ = 0;
      if (untyped_expectation == (ExpectationBase *)0x0) {
        std::allocator<char>::allocator();
        result._6_1_ = 1;
        std::__cxx11::string::string(local_708,"",(allocator *)((long)&result + 7));
        result._5_1_ = 1;
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_708);
        local_8b0 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_expectation,pvStack_20);
        local_8b0 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_03,iVar1);
      }
      this_local = local_8b0;
      if ((result._5_1_ & 1) != 0) {
        std::__cxx11::string::~string(local_708);
      }
      if ((result._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      }
    }
    else {
      poVar5 = std::operator<<(local_3b0,"    Function call: ");
      pcVar6 = Name(this);
      std::operator<<(poVar5,pcVar6);
      local_8d0 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x3c0) {
        local_8d0 = local_3b0;
      }
      (*this->_vptr_UntypedFunctionMockerBase[7])(this,pvStack_20,local_8d0);
      if (((local_6e1 & 1) != 0) && ((local_231 & 1) == 0)) {
        local_8e0 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x6d0) {
          local_8e0 = aoStack_6c0;
        }
        ExpectationBase::DescribeLocationTo(pEStack_6e0,local_8e0);
      }
      pvVar3 = pvStack_20;
      local_739 = 0;
      if (untyped_expectation == (ExpectationBase *)0x0) {
        std::__cxx11::stringstream::str();
        local_739 = 1;
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_738);
        local_900 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_04,iVar1);
      }
      else {
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_expectation,pvStack_20);
        local_900 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_05,iVar1);
      }
      if ((local_739 & 1) != 0) {
        std::__cxx11::string::~string(local_738);
      }
      local_718 = local_900;
      if (local_900 != (UntypedFunctionMockerBase *)0x0) {
        local_918 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x3c0) {
          local_918 = local_3b0;
        }
        (*local_900->_vptr_UntypedFunctionMockerBase[2])(local_900,local_918);
      }
      poVar5 = std::operator<<(local_3b0,"\n");
      std::__cxx11::stringstream::str();
      std::operator<<(poVar5,local_760);
      std::__cxx11::string::~string(local_760);
      if ((local_6e1 & 1) == 0) {
        std::__cxx11::stringstream::str();
        Expect(false,(char *)0x0,-1,&local_780);
        std::__cxx11::string::~string((string *)&local_780);
      }
      else if ((local_231 & 1) == 0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::stringstream::str();
        std::operator+(&local_7c0,&local_7e0,&local_800);
        Log(kInfo,&local_7c0,2);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::__cxx11::string::~string((string *)&local_800);
        std::__cxx11::string::~string((string *)&local_7e0);
      }
      else {
        pcVar6 = ExpectationBase::file(pEStack_6e0);
        iVar1 = ExpectationBase::line(pEStack_6e0);
        std::__cxx11::stringstream::str();
        Expect(false,pcVar6,iVar1,&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
      }
      this_local = local_718;
    }
    result._0_4_ = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&untyped_action);
    std::__cxx11::stringstream::~stringstream(local_548);
    std::__cxx11::stringstream::~stringstream(local_3c0);
  }
  return (UntypedActionResultHolderBase *)this_local;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True iff we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when he wants informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
        // If the user wants this to be a warning, we print it only
        // when he wants to see warnings.
        reaction == kWarn ? LogIsVisible(kWarning) :
        // Otherwise, the user wants this to be an error, and we
        // should always print detailed information in the error.
        true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(untyped_args, "");
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    const UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != NULL)
      result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = NULL;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.
  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(
          untyped_args, &untyped_action, &is_excessive,
          &ss, &why);
  const bool found = untyped_expectation != NULL;

  // True iff we need to print the call's arguments and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return
        untyped_action == NULL ?
        this->UntypedPerformDefaultAction(untyped_args, "") :
        this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  const UntypedActionResultHolderBase* const result =
      untyped_action == NULL ?
      this->UntypedPerformDefaultAction(untyped_args, ss.str()) :
      this->UntypedPerformAction(untyped_action, untyped_args);
  if (result != NULL)
    result->PrintAsActionResult(&ss);
  ss << "\n" << why.str();

  if (!found) {
    // No expectation matches this call - reports a failure.
    Expect(false, NULL, -1, ss.str());
  } else if (is_excessive) {
    // We had an upper-bound violation and the failure message is in ss.
    Expect(false, untyped_expectation->file(),
           untyped_expectation->line(), ss.str());
  } else {
    // We had an expected call and the matching expectation is
    // described in ss.
    Log(kInfo, loc.str() + ss.str(), 2);
  }

  return result;
}